

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandDChoice(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  Abc_Ntk_t *pAVar3;
  char *pcVar4;
  uint local_54;
  uint local_50;
  int nLevelMax;
  int nConfMax;
  int c;
  int fConstruct;
  int fUpdateLevel;
  int fVerbose;
  int fBalance;
  Abc_Ntk_t *pNtkRes;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pAVar3 = Abc_FrameReadNtk(pAbc);
  fUpdateLevel = 1;
  c = 1;
  nConfMax = 0;
  local_50 = 1000;
  local_54 = 0;
  fConstruct = 0;
  Extra_UtilGetoptReset();
LAB_0027d271:
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"CLblcvh");
    if (iVar1 == -1) {
      if (pAVar3 == (Abc_Ntk_t *)0x0) {
        Abc_Print(-1,"Empty network.\n");
        return 1;
      }
      iVar1 = Abc_NtkIsStrash(pAVar3);
      if (iVar1 == 0) {
        Abc_Print(-1,"This command works only for strashed networks.\n");
        return 1;
      }
      pAVar3 = Abc_NtkDChoice(pAVar3,fUpdateLevel,c,nConfMax,local_50,local_54,fConstruct);
      if (pAVar3 == (Abc_Ntk_t *)0x0) {
        Abc_Print(-1,"Command has failed.\n");
        return 0;
      }
      Abc_FrameReplaceCurrentNetwork(pAbc,pAVar3);
      return 0;
    }
    switch(iVar1) {
    case 0x43:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-C\" should be followed by an integer.\n");
        goto LAB_0027d471;
      }
      local_50 = atoi(argv[globalUtilOptind]);
      uVar2 = local_50;
      break;
    default:
      goto LAB_0027d471;
    case 0x4c:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-L\" should be followed by an integer.\n");
        goto LAB_0027d471;
      }
      local_54 = atoi(argv[globalUtilOptind]);
      uVar2 = local_54;
      break;
    case 0x62:
      fUpdateLevel = fUpdateLevel ^ 1;
      goto LAB_0027d271;
    case 99:
      nConfMax = nConfMax ^ 1;
      goto LAB_0027d271;
    case 0x68:
      goto LAB_0027d471;
    case 0x6c:
      c = c ^ 1;
      goto LAB_0027d271;
    case 0x76:
      fConstruct = fConstruct ^ 1;
      goto LAB_0027d271;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if ((int)uVar2 < 0) {
LAB_0027d471:
      Abc_Print(-2,"usage: dchoice [-C num] [-L num] [-blcvh]\n");
      Abc_Print(-2,"\t         performs partitioned choicing using new AIG package\n");
      Abc_Print(-2,"\t-C num : the max number of conflicts at a node [default = %d]\n",
                (ulong)local_50);
      Abc_Print(-2,"\t-L num : the max level of nodes to consider (0 = not used) [default = %d]\n",
                (ulong)local_54);
      pcVar4 = "no";
      if (fUpdateLevel != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-b     : toggle internal balancing [default = %s]\n",pcVar4);
      pcVar4 = "no";
      if (c != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-l     : toggle updating level [default = %s]\n",pcVar4);
      pcVar4 = "no";
      if (nConfMax != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-c     : toggle constructive computation of choices [default = %s]\n",pcVar4);
      pcVar4 = "no";
      if (fConstruct != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggle verbose printout [default = %s]\n",pcVar4);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandDChoice( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    int fBalance, fVerbose, fUpdateLevel, fConstruct, c;
    int nConfMax, nLevelMax;

    extern Abc_Ntk_t * Abc_NtkDChoice( Abc_Ntk_t * pNtk, int fBalance, int fUpdateLevel, int fConstruct, int nConfMax, int nLevelMax, int fVerbose );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    fBalance     = 1;
    fUpdateLevel = 1;
    fConstruct   = 0;
    nConfMax     = 1000;
    nLevelMax    = 0;
    fVerbose     = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "CLblcvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nConfMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nConfMax < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            nLevelMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLevelMax < 0 )
                goto usage;
            break;
        case 'b':
            fBalance ^= 1;
            break;
        case 'l':
            fUpdateLevel ^= 1;
            break;
        case 'c':
            fConstruct ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "This command works only for strashed networks.\n" );
        return 1;
    }
    pNtkRes = Abc_NtkDChoice( pNtk, fBalance, fUpdateLevel, fConstruct, nConfMax, nLevelMax, fVerbose );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Command has failed.\n" );
        return 0;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: dchoice [-C num] [-L num] [-blcvh]\n" );
    Abc_Print( -2, "\t         performs partitioned choicing using new AIG package\n" );
    Abc_Print( -2, "\t-C num : the max number of conflicts at a node [default = %d]\n", nConfMax );
    Abc_Print( -2, "\t-L num : the max level of nodes to consider (0 = not used) [default = %d]\n", nLevelMax );
    Abc_Print( -2, "\t-b     : toggle internal balancing [default = %s]\n", fBalance? "yes": "no" );
    Abc_Print( -2, "\t-l     : toggle updating level [default = %s]\n", fUpdateLevel? "yes": "no" );
    Abc_Print( -2, "\t-c     : toggle constructive computation of choices [default = %s]\n", fConstruct? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle verbose printout [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}